

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

int __thiscall CPU::instrBIT0x2c(CPU *this)

{
  Memory *this_00;
  byte bVar1;
  uint16_t uVar2;
  
  this_00 = this->m;
  uVar2 = this->PC;
  this->PC = uVar2 + 2;
  uVar2 = Memory::Read16(this_00,uVar2);
  bVar1 = Memory::Read8(this_00,uVar2);
  this->field_0x2e =
       bVar1 >> 7 | bVar1 >> 5 & 2 | this->field_0x2e & 0xbc | ((this->A & bVar1) == 0) << 6;
  return 4;
}

Assistant:

int CPU::instrBIT0x2c() {
	BIT(absolute_addr());
	return 4;
}